

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

int __thiscall rw::StreamMemory::open(StreamMemory *this,char *__file,int __oflag,...)

{
  uint in_ECX;
  
  this->data = (uint8 *)__file;
  this->capacity = in_ECX;
  this->length = __oflag;
  if (in_ECX < (uint)__oflag) {
    this->capacity = __oflag;
  }
  this->position = 0;
  return (int)this;
}

Assistant:

StreamMemory*
StreamMemory::open(uint8 *data, uint32 length, uint32 capacity)
{
	this->data = data;
	this->capacity = capacity;
	this->length = length;
	if(this->capacity < this->length)
		this->capacity = this->length;
	this->position = 0;
	return this;
}